

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_ssl_getsessionid
                (Curl_easy *data,connectdata *conn,_Bool isProxy,void **ssl_sessionid,size_t *idsize
                ,int sockindex)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *first;
  Curl_share *pCVar4;
  Curl_ssl_session *pCVar5;
  char *second;
  long lVar6;
  ssl_primary_config *data_00;
  proxy_info *ppVar7;
  _Bool _Var8;
  int iVar9;
  long *plVar10;
  undefined3 in_register_00000011;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  
  data_00 = &conn->proxy_ssl_config;
  ppVar7 = &conn->http_proxy;
  if (CONCAT31(in_register_00000011,isProxy) == 0) {
    data_00 = &conn->ssl_config;
    ppVar7 = (proxy_info *)&conn->host;
  }
  first = (ppVar7->host).name;
  iVar2 = (&conn->port)[!isProxy];
  *ssl_sessionid = (void *)0x0;
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    bVar1 = (data->set).proxy_ssl.primary.field_0x71;
  }
  else {
    bVar1 = (data->set).ssl.primary.field_0x71;
  }
  bVar14 = true;
  if ((bVar1 & 8) != 0) {
    if ((data->state).session == (Curl_ssl_session *)0x0) {
      bVar14 = true;
    }
    else {
      pCVar4 = data->share;
      if ((pCVar4 == (Curl_share *)0x0) || ((pCVar4->specifier & 0x10) == 0)) {
        plVar10 = &(data->state).sessionage;
      }
      else {
        plVar10 = &pCVar4->sessionage;
      }
      bVar14 = (data->set).general_ssl.max_ssl_sessions == 0;
      if (!bVar14) {
        lVar11 = 0x38;
        uVar12 = 0;
        do {
          pCVar5 = (data->state).session;
          if ((*(long *)((long)pCVar5 + lVar11 + -0x20) != 0) &&
             (iVar9 = Curl_strcasecompare(first,*(char **)((long)pCVar5 + lVar11 + -0x38)),
             iVar9 != 0)) {
            uVar3 = *(uint *)&(conn->bits).field_0x4;
            if ((uVar3 >> 9 & 1) == 0) {
              if (*(long *)((long)pCVar5 + lVar11 + -0x30) != 0) {
                if ((uVar3 >> 9 & 1) == 0) goto LAB_00506d61;
                goto LAB_00506ce4;
              }
            }
            else {
LAB_00506ce4:
              second = *(char **)((long)pCVar5 + lVar11 + -0x30);
              if ((second == (char *)0x0) ||
                 (iVar9 = Curl_strcasecompare((conn->conn_to_host).name,second), iVar9 == 0))
              goto LAB_00506d61;
            }
            uVar3 = *(uint *)&(conn->bits).field_0x4;
            if ((uVar3 >> 10 & 1) == 0) {
              if (*(int *)((long)pCVar5 + lVar11 + -4) != -1) {
                if ((uVar3 >> 10 & 1) == 0) goto LAB_00506d61;
                goto LAB_00506d19;
              }
            }
            else {
LAB_00506d19:
              iVar9 = *(int *)((long)pCVar5 + lVar11 + -4);
              if ((iVar9 == -1) || (conn->conn_to_port != iVar9)) goto LAB_00506d61;
            }
            if ((iVar2 == *(int *)((long)pCVar5 + lVar11 + -8)) &&
               ((iVar9 = Curl_strcasecompare(conn->handler->scheme,
                                             *(char **)((long)pCVar5 + lVar11 + -0x28)), iVar9 != 0
                && (_Var8 = Curl_ssl_config_matches
                                      (data_00,(ssl_primary_config *)((long)&pCVar5->name + lVar11))
                   , _Var8)))) {
              lVar6 = *plVar10;
              *plVar10 = lVar6 + 1;
              *(long *)((long)pCVar5 + lVar11 + -0x10) = lVar6 + 1;
              *ssl_sessionid = *(void **)((long)pCVar5 + lVar11 + -0x20);
              if (idsize != (size_t *)0x0) {
                *idsize = *(size_t *)((long)pCVar5 + lVar11 + -0x18);
              }
              return false;
            }
          }
LAB_00506d61:
          uVar12 = uVar12 + 1;
          lVar11 = lVar11 + 0xb0;
          bVar13 = uVar12 < (data->set).general_ssl.max_ssl_sessions;
          bVar14 = !bVar13;
        } while (bVar13);
      }
    }
  }
  return bVar14;
}

Assistant:

bool Curl_ssl_getsessionid(struct Curl_easy *data,
                           struct connectdata *conn,
                           const bool isProxy,
                           void **ssl_sessionid,
                           size_t *idsize, /* set 0 if unknown */
                           int sockindex)
{
  struct Curl_ssl_session *check;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

#ifndef CURL_DISABLE_PROXY
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char * const name = isProxy ?
    conn->http_proxy.host.name : conn->host.name;
  int port = isProxy ? (int)conn->port : conn->remote_port;
#else
  /* no proxy support */
  struct ssl_primary_config * const ssl_config = &conn->ssl_config;
  const char * const name = conn->host.name;
  int port = conn->remote_port;
#endif
  (void)sockindex;
  *ssl_sessionid = NULL;

#ifdef CURL_DISABLE_PROXY
  if(isProxy)
    return TRUE;
#endif

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  if(!SSL_SET_OPTION(primary.sessionid) || !data->state.session)
    /* session ID re-use is disabled or the session cache has not been
       setup */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(name, check->name) &&
       ((!conn->bits.conn_to_host && !check->conn_to_host) ||
        (conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(conn->conn_to_host.name, check->conn_to_host))) &&
       ((!conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (conn->bits.conn_to_port && check->conn_to_port != -1 &&
         conn->conn_to_port == check->conn_to_port)) &&
       (port == check->remote_port) &&
       strcasecompare(conn->handler->scheme, check->scheme) &&
       Curl_ssl_config_matches(ssl_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  DEBUGF(infof(data, "%s Session ID in cache for %s %s://%s:%d",
               no_match? "Didn't find": "Found",
               isProxy ? "proxy" : "host",
               conn->handler->scheme, name, port));
  return no_match;
}